

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::LightNode> *node,ssize_t id)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  long *plVar6;
  long *plVar7;
  runtime_error *this_00;
  ssize_t id_00;
  
  if (node->ptr == (LightNode *)0x0) {
    plVar1 = (long *)0x0;
  }
  else {
    plVar1 = (long *)__dynamic_cast(node->ptr,&SceneGraph::LightNode::typeinfo,
                                    &SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>::
                                     typeinfo,0);
  }
  if (plVar1 == (long *)0x0) {
    if (node->ptr == (LightNode *)0x0) {
      plVar2 = (long *)0x0;
    }
    else {
      plVar2 = (long *)__dynamic_cast(node->ptr,&SceneGraph::LightNode::typeinfo,
                                      &SceneGraph::LightNodeImpl<embree::SceneGraph::PointLight>::
                                       typeinfo,0);
    }
    if (plVar2 == (long *)0x0) {
      if (node->ptr == (LightNode *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(node->ptr,&SceneGraph::LightNode::typeinfo,
                                        &SceneGraph::
                                         LightNodeImpl<embree::SceneGraph::DirectionalLight>::
                                         typeinfo,0);
      }
      if (plVar3 == (long *)0x0) {
        if (node->ptr == (LightNode *)0x0) {
          plVar4 = (long *)0x0;
        }
        else {
          plVar4 = (long *)__dynamic_cast(node->ptr,&SceneGraph::LightNode::typeinfo,
                                          &SceneGraph::LightNodeImpl<embree::SceneGraph::SpotLight>
                                           ::typeinfo,0);
        }
        if (plVar4 == (long *)0x0) {
          if (node->ptr == (LightNode *)0x0) {
            plVar5 = (long *)0x0;
          }
          else {
            plVar5 = (long *)__dynamic_cast(node->ptr,&SceneGraph::LightNode::typeinfo,
                                            &SceneGraph::
                                             LightNodeImpl<embree::SceneGraph::DistantLight>::
                                             typeinfo,0);
          }
          if (plVar5 == (long *)0x0) {
            if (node->ptr == (LightNode *)0x0) {
              plVar6 = (long *)0x0;
            }
            else {
              plVar6 = (long *)__dynamic_cast(node->ptr,&SceneGraph::LightNode::typeinfo,
                                              &SceneGraph::
                                               LightNodeImpl<embree::SceneGraph::TriangleLight>::
                                               typeinfo,0);
            }
            if (plVar6 == (long *)0x0) {
              if (node->ptr == (LightNode *)0x0) {
                plVar7 = (long *)0x0;
              }
              else {
                plVar7 = (long *)__dynamic_cast(node->ptr,&SceneGraph::LightNode::typeinfo,
                                                &SceneGraph::
                                                 LightNodeImpl<embree::SceneGraph::QuadLight>::
                                                 typeinfo,0);
              }
              if (plVar7 == (long *)0x0) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_00,"unsupported light");
                __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              (**(code **)(*plVar7 + 0x10))(plVar7);
              store(this,(QuadLight *)(plVar7 + 0xe),id);
              (**(code **)(*plVar7 + 0x18))(plVar7);
            }
            else {
              (**(code **)(*plVar6 + 0x10))(plVar6);
              store(this,(TriangleLight *)(plVar6 + 0xe),id);
            }
            if (plVar6 != (long *)0x0) {
              (**(code **)(*plVar6 + 0x18))(plVar6);
            }
          }
          else {
            (**(code **)(*plVar5 + 0x10))(plVar5);
            store(this,(DistantLight *)(plVar5 + 0xe),id);
          }
          if (plVar5 != (long *)0x0) {
            (**(code **)(*plVar5 + 0x18))();
          }
        }
        else {
          (**(code **)(*plVar4 + 0x10))(plVar4);
          store(this,(SpotLight *)(plVar4 + 0xe),id);
        }
        if (plVar4 != (long *)0x0) {
          (**(code **)(*plVar4 + 0x18))();
        }
      }
      else {
        (**(code **)(*plVar3 + 0x10))(plVar3);
        store(this,(DirectionalLight *)(plVar3 + 0xe),id);
      }
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0x18))(plVar3);
      }
    }
    else {
      (**(code **)(*plVar2 + 0x10))(plVar2);
      store(this,(PointLight *)(plVar2 + 0xe),id);
    }
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x18))(plVar2);
    }
  }
  else {
    (**(code **)(*plVar1 + 0x10))(plVar1);
    store(this,(AmbientLight *)(plVar1 + 0xe),id_00);
  }
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x18))(plVar1);
  }
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::LightNode> node, ssize_t id)
  {
    if (auto light = node.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::AmbientLight>>())
      store(light->light,id);
    else if (auto light = node.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::PointLight>>())
      store(light->light,id);
    else if (auto light = node.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::DirectionalLight>>())
      store(light->light,id);
    else if (auto light = node.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::SpotLight>>())
      store(light->light,id);
    else if (auto light = node.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::DistantLight>>())
      store(light->light,id);
    else if (auto light = node.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::TriangleLight>>())
      store(light->light,id);
    else if (auto light = node.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::QuadLight>>())
      store(light->light,id);
    else
      throw std::runtime_error("unsupported light");
  }